

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  ushort *puVar1;
  ushort *puVar2;
  short *psVar3;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  Descriptor *this_00;
  FieldDescriptor *pFVar7;
  FieldDescriptor *this_01;
  EnumDescriptor *this_02;
  EnumValueDescriptor *pEVar8;
  _anonymous_namespace_ *this_03;
  undefined1 in_R8B;
  size_type __rlen;
  ulong __n;
  bool bVar9;
  string_view element_name;
  string_view element_name_00;
  string_view input;
  string local_d0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum *local_60;
  pointer local_58;
  
  this_00 = FieldDescriptor::message_type(field);
  if (((((this_00->extension_count_ == 0) && (0xbf < (byte)field->field_0x1)) &&
       (this_00->extension_range_count_ == 0)) &&
      ((this_00->nested_type_count_ == 0 && (this_00->enum_type_count_ == 0)))) &&
     (this_00->field_count_ == 2)) {
    puVar1 = (ushort *)(this_00->all_names_).payload_;
    __n = (ulong)*puVar1;
    puVar2 = (ushort *)(field->all_names_).payload_;
    this_03 = (_anonymous_namespace_ *)(ulong)*puVar2;
    input._M_len = (long)puVar2 + ~(ulong)this_03;
    input._M_str = (char *)0x0;
    protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_(&local_d0,this_03,input,(bool)in_R8B);
    local_60 = (AlphaNum *)local_d0._M_string_length;
    local_58 = local_d0._M_dataplus._M_p;
    local_90.piece_._M_len = 5;
    local_90.piece_._M_str = "Entry";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&local_60,&local_90,(AlphaNum *)local_d0._M_string_length);
    bVar9 = true;
    if ((local_b0._M_string_length == __n) &&
       ((__n == 0 ||
        (iVar6 = bcmp((void *)((long)puVar1 + ~__n),local_b0._M_dataplus._M_p,__n), iVar6 == 0)))) {
      bVar9 = field->containing_type_ != this_00->containing_type_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) {
      pFVar7 = Descriptor::map_key(this_00);
      this_01 = Descriptor::map_value(this_00);
      if (((((pFVar7->field_0x1 & 0xc0) == 0x40) && (pFVar7->number_ == 1)) &&
          (psVar3 = (short *)(pFVar7->all_names_).payload_, *psVar3 == 3)) &&
         ((((char)psVar3[-1] == 'y' && psVar3[-2] == 0x656b && ((this_01->field_0x1 & 0xc0) == 0x40)
           ) && ((this_01->number_ == 2 &&
                 ((psVar3 = (short *)(this_01->all_names_).payload_, *psVar3 == 5 &&
                  ((char)psVar3[-1] == 'e' && *(int *)(psVar3 + -3) == 0x756c6176)))))))) {
        bVar5 = pFVar7->type_ - 1;
        if ((bVar5 < 0xe) && ((0x2e03U >> (bVar5 & 0x1f) & 1) != 0)) {
          pcVar4 = (field->all_names_).payload_;
          element_name._M_len = (ulong)*(ushort *)(pcVar4 + 2);
          element_name._M_str = pcVar4 + ~element_name._M_len;
          AddError(this,element_name,&proto->super_Message,TYPE,
                   &DAT_003e0da8 + *(int *)(&DAT_003e0da8 + (ulong)bVar5 * 4));
        }
        if (this_01->type_ != '\x0e') {
          return true;
        }
        this_02 = FieldDescriptor::enum_type(this_01);
        pEVar8 = EnumDescriptor::value(this_02,0);
        if (pEVar8->number_ == 0) {
          return true;
        }
        pcVar4 = (field->all_names_).payload_;
        element_name_00._M_len = (ulong)*(ushort *)(pcVar4 + 2);
        element_name_00._M_str = pcVar4 + ~element_name_00._M_len;
        AddError(this,element_name_00,&proto->super_Message,TYPE,
                 "Enum value in map must define 0 as the first value.");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(const FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (  // Must not contain extensions, extension range or nested message or
        // enums
      message->extension_count() != 0 ||
      field->label_ != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() !=
          absl::StrCat(ToCamelCase(field->name(), false), "Entry") ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->map_key();
  const FieldDescriptor* value = message->map_value();
  if (key->label_ != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label_ != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
      // Do not add a default, so that the compiler will complain when new types
      // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}